

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O0

_Bool gravity_vm_runclosure
                (gravity_vm *vm,gravity_closure_t *closure,gravity_value_t sender,
                gravity_value_t *params,uint16_t nparams)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  _Bool _Var4;
  byte bVar5;
  uint uVar6;
  gravity_callframe_t *pgVar7;
  gravity_list_t *local_d0;
  uint local_c4;
  gravity_list_t *local_c0;
  uint32_t local_b8;
  uint local_ac;
  uint local_a8;
  _Bool local_a3;
  ushort local_a2;
  _Bool result;
  uint16_t i_1;
  gravity_callframe_t *cframe;
  uint16_t i;
  uint32_t _rneed;
  gravity_vm *local_80;
  gravity_value_t selfvalue;
  uint32_t *ip;
  gravity_callframe_t *frame;
  uint32_t stacktopdelta;
  uint32_t rwin;
  gravity_value_t *stackstart;
  gravity_fiber_t *fiber;
  gravity_function_t *f;
  gravity_value_t *pgStack_38;
  uint16_t nparams_local;
  gravity_value_t *params_local;
  gravity_closure_t *closure_local;
  gravity_vm *vm_local;
  gravity_value_t sender_local;
  
  sender_local.isa = (gravity_class_t *)sender.field_1;
  vm_local = (gravity_vm *)sender.isa;
  if (((vm == (gravity_vm *)0x0) || (closure == (gravity_closure_t *)0x0)) ||
     ((vm->aborted & 1U) != 0)) {
    sender_local.field_1.n._7_1_ = 0;
  }
  else {
    fiber = (gravity_fiber_t *)closure->f;
    if ((((gravity_function_t *)fiber == (gravity_function_t *)0x0) ||
        (((gravity_function_t *)fiber)->tag != EXEC_TYPE_NATIVE)) ||
       (((((gravity_function_t *)fiber)->field_9).field_0.bytecode != (uint32_t *)0x0 &&
        ((((gravity_function_t *)fiber)->field_9).field_0.ninsts != 0)))) {
      stackstart = (gravity_value_t *)vm->fiber;
      _stacktopdelta = (gravity_object_t *)0x0;
      frame._4_4_ = 0;
      local_80 = vm_local;
      selfvalue.isa = sender_local.isa;
      if (closure->context != (gravity_object_t *)0x0) {
        local_80 = (gravity_vm *)closure->context->isa;
        selfvalue.isa = closure->context;
      }
      f._6_2_ = nparams;
      pgStack_38 = params;
      params_local = (gravity_value_t *)closure;
      closure_local = (gravity_closure_t *)vm;
      if (((gravity_fiber_t *)stackstart)->nframes == 0) {
        gravity_fiber_reassign(vm->fiber,closure,nparams + 1);
        _stacktopdelta = *(gravity_object_t **)((closure_local->gc).free + 0x30);
        uVar1._0_1_ = (params_local[3].field_1.p)->has_outer;
        uVar1._1_1_ = (params_local[3].field_1.p)->is_struct;
        if (f._6_2_ + 1 < (uint)uVar1) {
          uVar2._0_1_ = (params_local[3].field_1.p)->has_outer;
          uVar2._1_1_ = (params_local[3].field_1.p)->is_struct;
          local_c4 = (uint)uVar2;
        }
        else {
          local_c4 = f._6_2_ + 1;
        }
        uVar3._0_1_ = (params_local[3].field_1.p)->is_inited;
        uVar3._1_1_ = (params_local[3].field_1.p)->unused;
        frame._0_4_ = local_c4 + uVar3 + (uint)*(ushort *)(params_local[3].field_1.n + 0x44);
        _stacktopdelta->isa = (gravity_class_t *)local_80;
        ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&_stacktopdelta->gc)->p = selfvalue.isa;
        for (local_a2 = 0; local_a2 < f._6_2_; local_a2 = local_a2 + 1) {
          (&_stacktopdelta->isa)[(ulong)(local_a2 + 1) * 2] = pgStack_38[local_a2].isa;
          *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
           (&_stacktopdelta->isa + (ulong)(local_a2 + 1) * 2 + 1) = pgStack_38[local_a2].field_1;
        }
        ip = (uint32_t *)stackstart[4].field_1.p;
        selfvalue.field_1.n = (gravity_int_t)((gravity_object_t *)ip)->isa;
        if ((*(int *)&(params_local[3].field_1.p)->xdata == 0) &&
           ((*(byte *)(params_local[3].field_1.n + 0xb4) & 1) != 0)) {
          local_d0 = gravity_list_from_array
                               ((gravity_vm *)closure_local,(uint)f._6_2_,
                                (gravity_value_t *)
                                ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                                 &_stacktopdelta->gc + 1));
        }
        else {
          local_d0 = (gravity_list_t *)0x0;
        }
        (((gravity_object_t *)ip)->gc).free = (gravity_gc_callback)local_d0;
      }
      else {
        ip = (uint32_t *)
             (((gravity_fiber_t *)stackstart)->frames +
             (((gravity_fiber_t *)stackstart)->nframes - 1));
        _stacktopdelta = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)ip + 0x20))->p;
        selfvalue.field_1.n = *(gravity_int_t *)ip;
        if (*(uint16_t *)((long)ip + 0xc) <
            ((gravity_function_t *)
            ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)ip + 0x18))->p->identifier)->
            nparams) {
          uVar1 = ((gravity_function_t *)
                  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)ip + 0x18))->p->
                  identifier)->nparams;
        }
        else {
          uVar1 = *(uint16_t *)((long)ip + 0xc);
        }
        local_a8 = (uint)uVar1;
        frame._4_4_ = local_a8 +
                      ((gravity_function_t *)
                      ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)ip + 0x18))->p->
                      identifier)->nlocals +
                      (uint)((gravity_function_t *)
                            ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)ip + 0x18))->p
                            ->identifier)->ntemps;
        if (nparams + 1 < (uint)((gravity_function_t *)fiber)->nparams) {
          local_ac = (uint)((gravity_function_t *)fiber)->nparams;
        }
        else {
          local_ac = nparams + 1;
        }
        uVar6 = local_ac + ((gravity_function_t *)fiber)->nlocals +
                (uint)((gravity_function_t *)fiber)->ntemps;
        if ((long)((long)_stacktopdelta +
                  (((ulong)uVar6 * 0x10 + (ulong)frame._4_4_ * 0x10) - (long)vm->fiber->stacktop))
            >> 4 < 1) {
          local_b8 = 0;
        }
        else {
          local_b8 = (uint32_t)
                     ((long)((long)_stacktopdelta +
                            (((ulong)uVar6 * 0x10 + (ulong)frame._4_4_ * 0x10) -
                            (long)vm->fiber->stacktop)) >> 4);
        }
        frame._0_4_ = local_b8;
        _Var4 = gravity_check_stack(vm,vm->fiber,local_b8,(gravity_value_t **)&stacktopdelta);
        if (!_Var4) {
          *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)ip = selfvalue.field_1;
          report_runtime_error
                    ((gravity_vm *)closure_local,GRAVITY_ERROR_RUNTIME,
                     "Infinite loop detected. Current execution must be aborted.");
          return false;
        }
        (&_stacktopdelta->isa)[(ulong)frame._4_4_ * 2] = (gravity_class_t *)local_80;
        ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
        (&_stacktopdelta->isa + (ulong)frame._4_4_ * 2 + 1))->p = selfvalue.isa;
        for (cframe._2_2_ = 0; cframe._2_2_ < f._6_2_; cframe._2_2_ = cframe._2_2_ + 1) {
          (&_stacktopdelta->isa)[(ulong)(frame._4_4_ + cframe._2_2_ + 1) * 2] =
               pgStack_38[cframe._2_2_].isa;
          *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
           (&_stacktopdelta->isa + (ulong)(frame._4_4_ + cframe._2_2_ + 1) * 2 + 1) =
               pgStack_38[cframe._2_2_].field_1;
        }
        *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)ip = selfvalue.field_1;
        pgVar7 = gravity_new_callframe((gravity_vm *)closure_local,(gravity_fiber_t *)stackstart);
        if (pgVar7 == (gravity_callframe_t *)0x0) {
          return false;
        }
        pgVar7->closure = (gravity_closure_t *)params_local;
        pgVar7->stackstart = (gravity_value_t *)(&_stacktopdelta->isa + (ulong)frame._4_4_ * 2);
        pgVar7->ip = *(uint32_t **)(params_local[3].field_1.n + 0xa0);
        pgVar7->dest = frame._4_4_;
        pgVar7->nargs = f._6_2_ + 1;
        pgVar7->outloop = false;
        if ((*(int *)&(params_local[3].field_1.p)->xdata == 0) &&
           ((*(byte *)(params_local[3].field_1.n + 0xb4) & 1) != 0)) {
          local_c0 = gravity_list_from_array
                               ((gravity_vm *)closure_local,(uint)f._6_2_,
                                (gravity_value_t *)
                                ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
                                 &_stacktopdelta->gc + (ulong)frame._4_4_ * 2 + 1));
        }
        else {
          local_c0 = (gravity_list_t *)0x0;
        }
        pgVar7->args = local_c0;
        pgVar7->outloop = true;
      }
      local_a3 = false;
      switch(*(undefined4 *)&fiber->frames) {
      case 0:
        *(int *)&closure_local->f = *(int *)&closure_local->f + 1;
        if (*(uint *)((long)&closure_local->vm + 4) < *(uint *)&closure_local->f) {
          *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)ip = selfvalue.field_1;
          report_runtime_error
                    ((gravity_vm *)closure_local,GRAVITY_ERROR_RUNTIME,
                     "Maximum number of nested C calls reached (%d).",
                     (ulong)*(uint *)((long)&closure_local->vm + 4));
          return false;
        }
        local_a3 = gravity_vm_exec((gravity_vm *)closure_local);
        *(int *)&closure_local->f = *(int *)&closure_local->f + -1;
        break;
      case 1:
        gravity_gc_setenabled((gravity_vm *)closure_local,false);
        bVar5 = (**(code **)&fiber->nframes)
                          (closure_local,&_stacktopdelta->isa + (ulong)frame._4_4_ * 2,f._6_2_,
                           0xfffffffe);
        local_a3 = (_Bool)(bVar5 & 1);
        gravity_gc_setenabled((gravity_vm *)closure_local,true);
        break;
      case 2:
        if (*(long *)(*(long *)&closure_local->gc + 0x88) != 0) {
          gravity_gc_setenabled((gravity_vm *)closure_local,false);
          bVar5 = (**(code **)(*(long *)&closure_local->gc + 0x88))
                            (closure_local,fiber->stack,local_80,selfvalue.isa,
                             &_stacktopdelta->isa + (ulong)frame._4_4_ * 2,(int)(short)f._6_2_,
                             0xfffffffe);
          local_a3 = (_Bool)(bVar5 & 1);
          gravity_gc_setenabled((gravity_vm *)closure_local,true);
        }
        break;
      case 3:
        local_a3 = false;
      }
      if (stackstart == (gravity_value_t *)(closure_local->gc).free) {
        if (*(int *)&fiber->frames != 0) {
          *(int *)&stackstart[5].isa = *(int *)&stackstart[5].isa + -1;
        }
        stackstart[3].field_1.p =
             (gravity_object_t *)((long)stackstart[3].field_1.p + (ulong)(uint32_t)frame * -0x10);
      }
      sender_local.field_1.n._7_1_ = local_a3;
    }
    else {
      sender_local.field_1.n._7_1_ = 1;
    }
  }
  return (_Bool)sender_local.field_1.n._7_1_;
}

Assistant:

bool gravity_vm_runclosure (gravity_vm *vm, gravity_closure_t *closure, gravity_value_t sender, gravity_value_t params[], uint16_t nparams) {
    if (!vm || !closure || vm->aborted) return false;

    // do not waste cycles on empty functions
    gravity_function_t *f = closure->f;
    if (f && (f->tag == EXEC_TYPE_NATIVE) && ((!f->bytecode) || (f->ninsts == 0))) return true;

    // current execution fiber
    gravity_fiber_t     *fiber = vm->fiber;
    gravity_value_t     *stackstart = NULL;
    uint32_t            rwin = 0;
	uint32_t			stacktopdelta = 0;
    
    // current frame and current instruction pointer
    gravity_callframe_t *frame;
    uint32_t            *ip;
	
    DEBUG_STACK();

    // self value is default to the context where the closure has been created (or set by the user)
    gravity_value_t selfvalue;

    // MSVC bug: designated initializer was prematurely evaluated
    if (closure->context) selfvalue = VALUE_FROM_OBJECT(closure->context);
    else selfvalue = sender;
    
    // we need a way to give user the ability to access the sender value from a closure
    
    // if fiber->nframes is not zero it means that this event has been recursively called
    // from somewhere inside the main function so we need to protect and correctly setup
    // the new activation frame
    if (fiber->nframes) {
        // current call frame
        frame = &fiber->frames[fiber->nframes - 1];

        // current top of the stack
        stackstart = frame->stackstart;

        // current instruction pointer
        ip = frame->ip;

        // compute register window
        rwin = FN_COUNTREG(frame->closure->f, frame->nargs);

        // check stack size
        uint32_t _rneed = FN_COUNTREG(f,nparams+1);
		stacktopdelta = (uint32_t)MAXNUM(stackstart + rwin + _rneed - vm->fiber->stacktop, 0);
        if (!gravity_check_stack(vm, vm->fiber, stacktopdelta, &stackstart)) {
            RUNTIME_ERROR("Infinite loop detected. Current execution must be aborted.");
        }
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        STORE_FRAME();
        PUSH_FRAME(closure, &stackstart[rwin], rwin, nparams+1);
        SETFRAME_OUTLOOP(cframe);
    } else {
        // there are no execution frames when called outside main function
        gravity_fiber_reassign(vm->fiber, closure, nparams+1);
        stackstart = vm->fiber->stack;
		stacktopdelta = FN_COUNTREG(closure->f, nparams+1);
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        // check if closure uses the special _args instruction
        frame = &fiber->frames[0];
        ip = frame->ip;
        frame->args = (USE_ARGS(closure)) ? gravity_list_from_array(vm, nparams, &stackstart[rwin]+1) : NULL;
    }

    // f can be native, internal or bridge because this function
    // is called also by convert_value2string
    // for example in Creo:
    // var mData = Data();
    // Console.write("data: " + mData);
    // mData.String is a bridged objc method
    DEBUG_STACK();

    bool result = false;
    switch (f->tag) {
        case EXEC_TYPE_NATIVE:
            ++vm->nccalls;
            if (vm->nccalls > vm->maxccalls) RUNTIME_ERROR("Maximum number of nested C calls reached (%d).", vm->maxccalls);
            result = gravity_vm_exec(vm);
            --vm->nccalls;
            break;

        case EXEC_TYPE_INTERNAL:
            BEGIN_TRUST_USERCODE(vm);
            result = f->internal(vm, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
            END_TRUST_USERCODE(vm);
            break;

        case EXEC_TYPE_BRIDGED:
            if (vm->delegate->bridge_execute) {
                BEGIN_TRUST_USERCODE(vm);
                result = vm->delegate->bridge_execute(vm, f->xdata, selfvalue, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
                END_TRUST_USERCODE(vm);
            }
            break;

        case EXEC_TYPE_SPECIAL:
            result = false;
            break;
    }
    
    if (fiber == vm->fiber) {
        // fix pointers ONLY if fiber remains the same
        if (f->tag != EXEC_TYPE_NATIVE) --fiber->nframes;
        fiber->stacktop -= stacktopdelta;
    }
	
    DEBUG_STACK();
    return result;
}